

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

LabelOpnd * IR::LabelOpnd::New(LabelInstr *labelInstr,Func *func)

{
  undefined1 *puVar1;
  LabelOpnd *pLVar2;
  
  pLVar2 = (LabelOpnd *)new<Memory::JitArenaAllocator>(0x18,func->m_alloc,0x3eba5c);
  (pLVar2->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (pLVar2->super_Opnd).m_type = TyIllegal;
  (pLVar2->super_Opnd).field_0xb = 0;
  (pLVar2->super_Opnd).m_kind = OpndKindInvalid;
  (pLVar2->super_Opnd).isDeleted = false;
  *(undefined2 *)&(pLVar2->super_Opnd).field_0xe = 0;
  pLVar2->m_label = (LabelInstr *)0x0;
  (pLVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8690;
  ValueType::ValueType(&(pLVar2->super_Opnd).m_valueType);
  puVar1 = &(pLVar2->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (pLVar2->super_Opnd).m_kind = OpndKindInvalid;
  (pLVar2->super_Opnd).isDeleted = false;
  (pLVar2->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d87a8;
  pLVar2->m_label = labelInstr;
  (pLVar2->super_Opnd).m_type = TyUint64;
  labelInstr->field_0x78 = labelInstr->field_0x78 | 4;
  (pLVar2->super_Opnd).m_kind = OpndKindLabel;
  return pLVar2;
}

Assistant:

LabelOpnd *
LabelOpnd::New(LabelInstr * labelInstr, Func * func)
{
    LabelOpnd * labelOpnd = JitAnew(func->m_alloc, IR::LabelOpnd);

    labelOpnd->m_label = labelInstr;
    labelOpnd->m_type = TyMachPtr;

    labelInstr->m_hasNonBranchRef = true;


    labelOpnd->m_kind = OpndKindLabel;

    return labelOpnd;
}